

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# taia_add.c
# Opt level: O0

void taia_add(taia *t,taia *u,taia *v)

{
  taia *v_local;
  taia *u_local;
  taia *t_local;
  
  (t->sec).x = (u->sec).x + (v->sec).x;
  t->nano = u->nano + v->nano;
  t->atto = u->atto + v->atto;
  if (999999999 < t->atto) {
    t->atto = t->atto - 1000000000;
    t->nano = t->nano + 1;
  }
  if (999999999 < t->nano) {
    t->nano = t->nano - 1000000000;
    (t->sec).x = (t->sec).x + 1;
  }
  return;
}

Assistant:

void taia_add(struct taia *t,const struct taia *u,const struct taia *v)
{
  t->sec.x = u->sec.x + v->sec.x;
  t->nano = u->nano + v->nano;
  t->atto = u->atto + v->atto;
  if (t->atto > 999999999UL) {
    t->atto -= 1000000000UL;
    ++t->nano;
  }
  if (t->nano > 999999999UL) {
    t->nano -= 1000000000UL;
    ++t->sec.x;
  }
}